

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O1

void test_2d_dynamic<5ul,5ul,0ul,1ul,30ul,30ul>(void)

{
  int *piVar1;
  undefined8 uVar2;
  int *piVar3;
  long lVar4;
  int *piVar5;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  vector<int,_std::allocator<int>_> local_70;
  int *local_58;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  long local_38;
  
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_88 = (int *)CONCAT71(local_88._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_70,(bool *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_88._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  local_88 = (int *)CONCAT44(local_88._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_88 = (int *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_88 = (int *)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_88 = (int *)CONCAT71(local_88._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_70,(bool *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_88 = (int *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x96;
  local_88 = (int *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x24;
  local_88 = (int *)0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003a2;
  local_88 = (int *)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&local_88);
  local_88 = (int *)CONCAT44(local_88._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,0x3a2,(value_type_conflict1 *)&local_88,(allocator_type *)&local_90);
  piVar3 = (int *)0x0;
  local_40 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_80 = (int *)0x0;
  local_78 = (int *)0x0;
  do {
    lVar4 = 0;
    local_58 = piVar3;
    do {
      piVar5 = (int *)((long)local_80 + lVar4);
      local_90 = piVar5;
      local_88 = piVar5;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      piVar1 = (int *)((long)local_40 + (long)piVar3);
      local_50 = local_40 + (long)local_88;
      local_90 = piVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      if (local_78 == (int *)0x1e) {
        *piVar1 = 0x18;
        local_90._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe5,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= piVar5) goto LAB_00109b90;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe8,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)piVar3),(int *)&local_90)
        ;
      }
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 1;
    } while (lVar4 != 0x1e);
    local_78 = (int *)((long)local_78 + 1);
    local_80 = (int *)((long)local_80 + 0x1e);
    piVar3 = local_58 + 0x1e;
  } while (local_78 != (int *)0x1f);
  piVar5 = (int *)0x0;
  local_80 = (int *)0x0;
  local_48 = 0;
  do {
    lVar4 = 0;
    local_58 = piVar5;
    do {
      local_90 = (int *)((long)local_80 + lVar4);
      local_88 = local_90;
      local_78 = local_90;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      piVar3 = (int *)((long)local_40 + (long)piVar5);
      local_50 = local_40 + (long)local_88;
      local_90 = piVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      *piVar3 = 0x47;
      local_90._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,piVar3,(int *)&local_90);
      if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_78) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00109b82;
      }
      local_90 = (int *)CONCAT44(local_90._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)piVar5),(int *)&local_90);
      lVar4 = lVar4 + 5;
      piVar5 = piVar5 + 5;
    } while (lVar4 != 0x1e);
    local_48 = local_48 + 1;
    local_80 = (int *)((long)local_80 + 0x96);
    piVar5 = local_58 + 0x96;
  } while (local_48 != 6);
  lVar4 = 0;
  local_58 = (int *)0x0;
  piVar5 = (int *)0x0;
  do {
    local_48 = (ulong)piVar5 % 5;
    piVar3 = (int *)0x0;
    local_38 = lVar4;
    do {
      local_90 = (int *)((long)local_58 + (long)piVar3);
      local_88 = local_90;
      local_80 = local_90;
      local_78 = piVar3;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_90,(unsigned_long *)&local_88);
      piVar1 = (int *)((long)local_40 + lVar4);
      local_50 = local_40 + (long)local_88;
      local_90 = piVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,&local_90,&local_50);
      if (piVar5 == (int *)0x1e) {
        local_90._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x116,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= local_80) goto LAB_00109b82;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x119,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar4),(int *)&local_90);
      }
      else if ((long)local_78 + ((ulong)piVar3 / 5) * -5 == 0 && local_48 == 0) {
        local_90._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= local_80) {
LAB_00109b82:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00109b90:
          uVar2 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,piVar5);
          if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar2);
        }
        local_90 = (int *)CONCAT44(local_90._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar4),(int *)&local_90);
      }
      else {
        local_90._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1,(int *)&local_90);
        if ((int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= local_80) goto LAB_00109b82;
        local_90 = (int *)CONCAT44(local_90._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar4),(int *)&local_90);
      }
      piVar3 = (int *)((long)local_78 + 1);
      lVar4 = lVar4 + 4;
    } while (piVar3 != (int *)0x1e);
    piVar5 = (int *)((long)piVar5 + 1);
    local_58 = (int *)((long)local_58 + 0x1e);
    lVar4 = local_38 + 0x78;
    if (piVar5 == (int *)0x1f) {
      if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}